

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaIsBlank(xmlChar *str,int len)

{
  int local_1c;
  byte *pbStack_18;
  int len_local;
  xmlChar *str_local;
  
  if (str != (xmlChar *)0x0) {
    local_1c = len;
    pbStack_18 = str;
    if (len < 0) {
      for (; *pbStack_18 != 0; pbStack_18 = pbStack_18 + 1) {
        if (((*pbStack_18 != 0x20) && ((*pbStack_18 < 9 || (10 < *pbStack_18)))) &&
           (*pbStack_18 != 0xd)) {
          return 0;
        }
      }
    }
    else {
      for (; *pbStack_18 != 0 && local_1c != 0; pbStack_18 = pbStack_18 + 1) {
        if ((*pbStack_18 != 0x20) &&
           (((*pbStack_18 < 9 || (10 < *pbStack_18)) && (*pbStack_18 != 0xd)))) {
          return 0;
        }
        local_1c = local_1c + -1;
      }
    }
  }
  return 1;
}

Assistant:

static int
xmlSchemaIsBlank(xmlChar * str, int len)
{
    if (str == NULL)
        return (1);
    if (len < 0) {
	while (*str != 0) {
	    if (!(IS_BLANK_CH(*str)))
		return (0);
	    str++;
	}
    } else while ((*str != 0) && (len != 0)) {
	if (!(IS_BLANK_CH(*str)))
	    return (0);
	str++;
	len--;
    }

    return (1);
}